

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * __thiscall
kj::_::Debug::
makeDescription<char_const(&)[24],char_const*&,unsigned_long&,char_const*&,unsigned_short&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [24],
          char **params_1,unsigned_long *params_2,char **params_3,unsigned_short *params_4)

{
  char **params_00;
  unsigned_long *params_01;
  char **params_02;
  unsigned_short *params_03;
  char **ppcVar1;
  ArrayPtr<kj::String> AVar2;
  ArrayPtr<kj::String> argValues_00;
  ArrayDisposer **local_110;
  undefined1 local_b8 [8];
  String argValues [5];
  char **params_local_3;
  unsigned_long *params_local_2;
  char **params_local_1;
  char (*params_local) [24];
  char *macroArgs_local;
  
  ppcVar1 = params_1;
  str<char_const(&)[24]>((String *)local_b8,(kj *)macroArgs,(char (*) [24])macroArgs);
  str<char_const*&>((String *)&argValues[0].content.disposer,(kj *)params,params_00);
  str<unsigned_long&>((String *)&argValues[1].content.disposer,(kj *)params_1,params_01);
  str<char_const*&>((String *)&argValues[2].content.disposer,(kj *)params_2,params_02);
  str<unsigned_short&>((String *)&argValues[3].content.disposer,(kj *)params_3,params_03);
  AVar2 = arrayPtr<kj::String>((String *)local_b8,5);
  argValues_00.size_ = (size_t)ppcVar1;
  argValues_00.ptr = (String *)AVar2.size_;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)AVar2.ptr,argValues_00);
  local_110 = &argValues[4].content.disposer;
  do {
    local_110 = local_110 + -3;
    String::~String((String *)local_110);
  } while (local_110 != (ArrayDisposer **)local_b8);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}